

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O1

int ssl_write_server_key_exchange(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_ciphersuite_t *info;
  mbedtls_ssl_handshake_params *pmVar1;
  mbedtls_ssl_config *pmVar2;
  mbedtls_ecp_curve_info **ppmVar3;
  bool bVar4;
  mbedtls_ecp_curve_info *pmVar5;
  mbedtls_ecp_curve_info **ppmVar6;
  uchar uVar7;
  int iVar8;
  mbedtls_key_exchange_type_t mVar9;
  mbedtls_pk_type_t sig_alg;
  mbedtls_md_type_t md_alg;
  mbedtls_ssl_key_cert *pmVar10;
  mbedtls_ecdhopt_curve *pmVar11;
  mbedtls_ecp_curve_info **ppmVar12;
  mbedtls_ecdhopt_curve g;
  mbedtls_pk_context *pmVar13;
  uchar *data;
  uchar *output;
  uchar *puVar14;
  size_t sVar15;
  long lVar16;
  size_t signature_len;
  size_t len;
  uchar hash [64];
  uchar *local_a0;
  undefined8 local_98;
  size_t local_90;
  mbedtls_pk_type_t local_88;
  mbedtls_key_exchange_type_t local_84;
  size_t local_80;
  uchar local_78 [72];
  
  puVar14 = ssl->out_msg;
  info = ssl->transform_negotiate->ciphersuite_info;
  if (0xfffffffd < info->key_exchange - MBEDTLS_KEY_EXCHANGE_ECJPAKE) {
    if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
       (pmVar10 = ssl->handshake->key_cert, pmVar10 == (mbedtls_ssl_key_cert *)0x0)) {
      pmVar10 = ssl->conf->key_cert;
    }
    if (pmVar10 == (mbedtls_ssl_key_cert *)0x0) {
      pmVar13 = (mbedtls_pk_context *)0x0;
    }
    else {
      pmVar13 = pmVar10->key;
    }
    iVar8 = mbedtls_pk_can_do(pmVar13,MBEDTLS_PK_ECKEY);
    if (iVar8 != 0) {
      pmVar1 = ssl->handshake;
      if ((pmVar1 == (mbedtls_ssl_handshake_params *)0x0) ||
         (pmVar10 = pmVar1->key_cert, pmVar10 == (mbedtls_ssl_key_cert *)0x0)) {
        pmVar10 = ssl->conf->key_cert;
      }
      mbedtls_ecdhopt_use_static_key
                (&pmVar1->ecdh_ctx,(mbedtls_ecp_keypair *)pmVar10->key->pk_ctx,MBEDTLS_ECDH_OURS);
    }
  }
  data = puVar14 + 4;
  mVar9 = info->key_exchange;
  lVar16 = 0;
  output = data;
  if (mVar9 < MBEDTLS_KEY_EXCHANGE_ECJPAKE) {
    if ((0x6a2U >> (mVar9 & 0x1f) & 1) != 0) {
      ssl->state = ssl->state + 1;
      return 0;
    }
    if ((0x140U >> (mVar9 & 0x1f) & 1) != 0) {
      puVar14[4] = '\0';
      puVar14[5] = '\0';
      lVar16 = 2;
      output = puVar14 + 6;
    }
  }
  if ((info->key_exchange - MBEDTLS_KEY_EXCHANGE_DHE_RSA & 0xfffffffb) == 0) {
    pmVar2 = ssl->conf;
    if ((pmVar2->dhm_P).p == (mbedtls_mpi_uint *)0x0) {
      return -0x7100;
    }
    if ((pmVar2->dhm_G).p == (mbedtls_mpi_uint *)0x0) {
      return -0x7100;
    }
    iVar8 = mbedtls_dhm_set_group(&ssl->handshake->dhm_ctx,&pmVar2->dhm_P,&pmVar2->dhm_G);
    if (iVar8 != 0) {
      return iVar8;
    }
    pmVar1 = ssl->handshake;
    sVar15 = mbedtls_mpi_size(&(pmVar1->dhm_ctx).P);
    iVar8 = mbedtls_dhm_make_params
                      (&pmVar1->dhm_ctx,(int)sVar15,output,&local_90,
                       (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng);
    if (iVar8 != 0) {
      return iVar8;
    }
    puVar14 = output + local_90;
    lVar16 = lVar16 + local_90;
    sVar15 = local_90;
    data = output;
  }
  else {
    sVar15 = 0;
    puVar14 = output;
  }
  mVar9 = info->key_exchange;
  local_a0 = puVar14;
  if ((mVar9 < MBEDTLS_KEY_EXCHANGE_ECDH_RSA) && ((0x118U >> (mVar9 & 0x1f) & 1) != 0)) {
    pmVar2 = ssl->conf;
    pmVar11 = pmVar2->curve_list;
    g = *pmVar11;
    if (g == MBEDTLS_ECP_DP_NONE) {
      ppmVar12 = (mbedtls_ecp_curve_info **)0x0;
    }
    else {
      ppmVar3 = ssl->handshake->curves;
      ppmVar6 = ppmVar3;
      pmVar5 = *ppmVar3;
      do {
        while (ppmVar12 = ppmVar6, pmVar5 != (mbedtls_ecp_curve_info *)0x0) {
          if (pmVar5->grp_id == g) goto LAB_0011ac14;
          ppmVar6 = ppmVar12 + 1;
          pmVar5 = ppmVar12[1];
        }
        g = pmVar11[1];
        pmVar11 = pmVar11 + 1;
        ppmVar6 = ppmVar3;
        pmVar5 = *ppmVar3;
      } while (g != MBEDTLS_ECP_DP_NONE);
    }
LAB_0011ac14:
    mVar9 = 0xffff8c80;
    if ((ppmVar12 == (mbedtls_ecp_curve_info **)0x0) || (*ppmVar12 == (mbedtls_ecp_curve_info *)0x0)
       ) {
      bVar4 = false;
    }
    else {
      mVar9 = mbedtls_ecdhopt_initiator
                        (&ssl->handshake->ecdh_ctx,g,&local_90,puVar14,0x4000 - lVar16,
                         (_func_int_void_ptr_uchar_ptr_size_t *)pmVar2->f_rng,pmVar2->p_rng);
      if (mVar9 == MBEDTLS_KEY_EXCHANGE_NONE) {
        lVar16 = lVar16 + local_90;
        bVar4 = true;
        local_a0 = puVar14 + local_90;
        sVar15 = local_90;
        data = puVar14;
      }
      else {
        bVar4 = false;
      }
    }
    if (!bVar4) {
      return mVar9;
    }
  }
  if (info->key_exchange - MBEDTLS_KEY_EXCHANGE_PSK < 0xfffffffd) goto LAB_0011ae1f;
  local_98 = 0;
  local_84 = mVar9;
  local_80 = sVar15;
  sig_alg = mbedtls_ssl_get_ciphersuite_sig_pk_alg(info);
  if (ssl->minor_ver == 3) {
    mVar9 = 0xffff9400;
    if ((sig_alg != MBEDTLS_PK_NONE) &&
       (md_alg = mbedtls_ssl_sig_hash_set_find(&ssl->handshake->hash_algs,sig_alg),
       md_alg != MBEDTLS_MD_NONE)) goto LAB_0011acf4;
LAB_0011ae17:
    sVar15 = 0;
  }
  else {
    md_alg = (uint)(info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA) << 2;
LAB_0011acf4:
    local_88 = sig_alg;
    if (md_alg == MBEDTLS_MD_NONE) {
      mVar9 = mbedtls_ssl_get_key_exchange_md_ssl_tls(ssl,local_78,data,local_80);
      if (mVar9 == MBEDTLS_KEY_EXCHANGE_NONE) {
        sVar15 = 0x24;
        goto LAB_0011ad51;
      }
      goto LAB_0011ae17;
    }
    mVar9 = mbedtls_ssl_get_key_exchange_md_tls1_2(ssl,local_78,data,local_80,md_alg);
    sVar15 = 0;
    if (mVar9 == MBEDTLS_KEY_EXCHANGE_NONE) {
LAB_0011ad51:
      if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
         (pmVar10 = ssl->handshake->key_cert, pmVar10 == (mbedtls_ssl_key_cert *)0x0)) {
        pmVar10 = ssl->conf->key_cert;
      }
      mVar9 = 0xffff8a00;
      if ((pmVar10 != (mbedtls_ssl_key_cert *)0x0) && (pmVar10->key != (mbedtls_pk_context *)0x0)) {
        if (ssl->minor_ver == 3) {
          uVar7 = mbedtls_ssl_hash_from_md_alg(md_alg);
          *local_a0 = uVar7;
          uVar7 = mbedtls_ssl_sig_from_pk_alg(local_88);
          local_a0[1] = uVar7;
          local_a0 = local_a0 + 2;
          lVar16 = lVar16 + 2;
        }
        if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
           (pmVar10 = ssl->handshake->key_cert, pmVar10 == (mbedtls_ssl_key_cert *)0x0)) {
          pmVar10 = ssl->conf->key_cert;
        }
        if (pmVar10 == (mbedtls_ssl_key_cert *)0x0) {
          pmVar13 = (mbedtls_pk_context *)0x0;
        }
        else {
          pmVar13 = pmVar10->key;
        }
        mVar9 = mbedtls_pk_sign(pmVar13,md_alg,local_78,sVar15,local_a0 + 2,&local_98,
                                (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,
                                ssl->conf->p_rng);
        if (mVar9 == MBEDTLS_KEY_EXCHANGE_NONE) {
          *local_a0 = local_98._1_1_;
          local_a0[1] = (uchar)local_98;
          lVar16 = lVar16 + local_98 + 2;
          sVar15 = 1;
          mVar9 = local_84;
          goto LAB_0011ae1a;
        }
      }
      goto LAB_0011ae17;
    }
  }
LAB_0011ae1a:
  if ((char)sVar15 == '\0') {
    return mVar9;
  }
LAB_0011ae1f:
  ssl->out_msglen = lVar16 + 4;
  ssl->out_msgtype = 0x16;
  *ssl->out_msg = '\f';
  ssl->state = ssl->state + 1;
  iVar8 = mbedtls_ssl_write_record(ssl);
  return iVar8;
}

Assistant:

static int ssl_write_server_key_exchange( mbedtls_ssl_context *ssl )
{
    int ret;
    size_t n = 0;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info =
                            ssl->transform_negotiate->ciphersuite_info;

#if defined(MBEDTLS_KEY_EXCHANGE__SOME_PFS__ENABLED)
    unsigned char *p = ssl->out_msg + 4;
    size_t len;
#if defined(MBEDTLS_KEY_EXCHANGE__WITH_SERVER_SIGNATURE__ENABLED)
    unsigned char *dig_signed = p;
    size_t dig_signed_len = 0;
#endif /* MBEDTLS_KEY_EXCHANGE__WITH_SERVER_SIGNATURE__ENABLED */
#endif /* MBEDTLS_KEY_EXCHANGE__SOME_PFS__ENABLED */

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write server key exchange" ) );

    /*
     *
     * Part 1: Extract static ECDH parameters and abort
     *         if ServerKeyExchange not needed.
     *
     */

    /* For suites involving ECDH, extract DH parameters
     * from certificate at this point. */
#if defined(MBEDTLS_KEY_EXCHANGE__SOME__ECDH_ENABLED)
    if( mbedtls_ssl_ciphersuite_uses_ecdh( ciphersuite_info ) )
    {
        ssl_get_ecdh_params_from_cert( ssl );
    }
#endif /* MBEDTLS_KEY_EXCHANGE__SOME__ECDH_ENABLED */

    /* Key exchanges not involving ephemeral keys don't use
     * ServerKeyExchange, so end here. */
#if defined(MBEDTLS_KEY_EXCHANGE__SOME_NON_PFS__ENABLED)
    if( mbedtls_ssl_ciphersuite_no_pfs( ciphersuite_info ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip write server key exchange" ) );
        ssl->state++;
        return( 0 );
    }
#endif /* MBEDTLS_KEY_EXCHANGE__NON_PFS__ENABLED */

    /*
     *
     * Part 2: Provide key exchange parameters for chosen ciphersuite.
     *
     */

    /*
     * - ECJPAKE key exchanges
     */
#if defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE )
    {
        const unsigned char *end = ssl->out_msg + MBEDTLS_SSL_MAX_CONTENT_LEN;

        ret = mbedtls_ecjpake_write_round_two( &ssl->handshake->ecjpake_ctx,
                p, end - p, &len, ssl->conf->f_rng, ssl->conf->p_rng );
        if( ret != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecjpake_write_round_two", ret );
            return( ret );
        }

        p += len;
        n += len;
    }
#endif /* MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED */

    /*
     * For (EC)DHE key exchanges with PSK, parameters are prefixed by support
     * identity hint (RFC 4279, Sec. 3). Until someone needs this feature,
     * we use empty support identity hints here.
     **/
#if defined(MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED)   || \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
    {
        *(p++) = 0x00;
        *(p++) = 0x00;

        n += 2;
    }
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED */

    /*
     * - DHE key exchanges
     */
#if defined(MBEDTLS_KEY_EXCHANGE__SOME__DHE_ENABLED)
    if( mbedtls_ssl_ciphersuite_uses_dhe( ciphersuite_info ) )
    {
        if( ssl->conf->dhm_P.p == NULL || ssl->conf->dhm_G.p == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "no DH parameters set" ) );
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
        }

        /*
         * Ephemeral DH parameters:
         *
         * struct {
         *     opaque dh_p<1..2^16-1>;
         *     opaque dh_g<1..2^16-1>;
         *     opaque dh_Ys<1..2^16-1>;
         * } ServerDHParams;
         */
        if( ( ret = mbedtls_dhm_set_group( &ssl->handshake->dhm_ctx,
                                           &ssl->conf->dhm_P,
                                           &ssl->conf->dhm_G ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_dhm_set_group", ret );
            return( ret );
        }

        if( ( ret = mbedtls_dhm_make_params( &ssl->handshake->dhm_ctx,
                        (int) mbedtls_mpi_size( &ssl->handshake->dhm_ctx.P ),
                        p, &len, ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_dhm_make_params", ret );
            return( ret );
        }

#if defined(MBEDTLS_KEY_EXCHANGE__WITH_SERVER_SIGNATURE__ENABLED)
        dig_signed = p;
        dig_signed_len = len;
#endif

        p += len;
        n += len;

        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: X ", &ssl->handshake->dhm_ctx.X  );
        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: P ", &ssl->handshake->dhm_ctx.P  );
        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: G ", &ssl->handshake->dhm_ctx.G  );
        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: GX", &ssl->handshake->dhm_ctx.GX );
    }
#endif /* MBEDTLS_KEY_EXCHANGE__SOME__DHE_ENABLED */

    /*
     * - ECDHE key exchanges
     */
#if defined(MBEDTLS_KEY_EXCHANGE__SOME__ECDHE_ENABLED)
    if( mbedtls_ssl_ciphersuite_uses_ecdhe( ciphersuite_info ) )
    {
        /*
         * Ephemeral ECDH parameters:
         *
         * struct {
         *     ECParameters curve_params;
         *     ECPoint      public;
         * } ServerECDHParams;
         */
        const mbedtls_ecp_curve_info **curve = NULL;
        const mbedtls_ecp_group_id *gid;

        /* Match our preference list against the offered curves */
        for( gid = ssl->conf->curve_list; *gid != MBEDTLS_ECP_DP_NONE; gid++ )
            for( curve = ssl->handshake->curves; *curve != NULL; curve++ )
                if( (*curve)->grp_id == *gid )
                    goto curve_matching_done;

curve_matching_done:
        if( curve == NULL || *curve == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "no matching curve for ECDHE" ) );
            return( MBEDTLS_ERR_SSL_NO_CIPHER_CHOSEN );
        }

        MBEDTLS_SSL_DEBUG_MSG( 2, ( "ECDHE curve: %s", (*curve)->name ) );

        if( ( ret = mbedtls_ecdhopt_initiator( &ssl->handshake->ecdh_ctx, *gid,
                                       &len, p, MBEDTLS_SSL_MAX_CONTENT_LEN - n,
                                      ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecdhopt_initiator", ret );
            return( ret );
        }

#if defined(MBEDTLS_KEY_EXCHANGE__WITH_SERVER_SIGNATURE__ENABLED)
        dig_signed     = p;
        dig_signed_len = len;
#endif

        p += len;
        n += len;

    }
#endif /* MBEDTLS_KEY_EXCHANGE__SOME__ECDHE_ENABLED */

    /*
     *
     * Part 3: For key exchanges involving the server signing the
     *         exchange parameters, compute and add the signature here.
     *
     */
#if defined(MBEDTLS_KEY_EXCHANGE__WITH_SERVER_SIGNATURE__ENABLED)
    if( mbedtls_ssl_ciphersuite_uses_server_signature( ciphersuite_info ) )
    {
        size_t signature_len = 0;
        unsigned int hashlen = 0;
        unsigned char hash[64];

        /*
         * 3.1: Choose hash algorithm:
         * A: For TLS 1.2, obey signature-hash-algorithm extension
         *    to choose appropriate hash.
         * B: For SSL3, TLS1.0, TLS1.1 and ECDHE_ECDSA, use SHA1
         *    (RFC 4492, Sec. 5.4)
         * C: Otherwise, use MD5 + SHA1 (RFC 4346, Sec. 7.4.3)
         */

        mbedtls_md_type_t md_alg;

#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
        mbedtls_pk_type_t sig_alg =
            mbedtls_ssl_get_ciphersuite_sig_pk_alg( ciphersuite_info );
        if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
        {
            /* A: For TLS 1.2, obey signature-hash-algorithm extension
             *    (RFC 5246, Sec. 7.4.1.4.1). */
            if( sig_alg == MBEDTLS_PK_NONE ||
                ( md_alg = mbedtls_ssl_sig_hash_set_find( &ssl->handshake->hash_algs,
                                                          sig_alg ) ) == MBEDTLS_MD_NONE )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
                /* (... because we choose a cipher suite
                 *      only if there is a matching hash.) */
                return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
            }
        }
        else
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
        if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA )
        {
            /* B: Default hash SHA1 */
            md_alg = MBEDTLS_MD_SHA1;
        }
        else
#endif /* MBEDTLS_SSL_PROTO_SSL3 || MBEDTLS_SSL_PROTO_TLS1 || \
          MBEDTLS_SSL_PROTO_TLS1_1 */
        {
            /* C: MD5 + SHA1 */
            md_alg = MBEDTLS_MD_NONE;
        }

        MBEDTLS_SSL_DEBUG_MSG( 3, ( "pick hash algorithm %d for signing", md_alg ) );

        /*
         * 3.2: Compute the hash to be signed
         */
#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
        if( md_alg == MBEDTLS_MD_NONE )
        {
            hashlen = 36;
            ret = mbedtls_ssl_get_key_exchange_md_ssl_tls( ssl, hash,
                                                           dig_signed,
                                                           dig_signed_len );
            if( ret != 0 )
                return( ret );
        }
        else
#endif /* MBEDTLS_SSL_PROTO_SSL3 || MBEDTLS_SSL_PROTO_TLS1 || \
          MBEDTLS_SSL_PROTO_TLS1_1 */
#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if( md_alg != MBEDTLS_MD_NONE )
        {
            /* Info from md_alg will be used instead */
            hashlen = 0;
            ret = mbedtls_ssl_get_key_exchange_md_tls1_2( ssl, hash,
                                                          dig_signed,
                                                          dig_signed_len,
                                                          md_alg );
            if( ret != 0 )
                return( ret );
        }
        else
#endif /* MBEDTLS_SSL_PROTO_TLS1 || MBEDTLS_SSL_PROTO_TLS1_1 || \
          MBEDTLS_SSL_PROTO_TLS1_2 */
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        MBEDTLS_SSL_DEBUG_BUF( 3, "parameters hash", hash, hashlen != 0 ? hashlen :
            (unsigned int) ( mbedtls_md_get_size( mbedtls_md_info_from_type( md_alg ) ) ) );

        /*
         * 3.3: Compute and add the signature
         */
        if( mbedtls_ssl_own_key( ssl ) == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "got no private key" ) );
            return( MBEDTLS_ERR_SSL_PRIVATE_KEY_REQUIRED );
        }

#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
        {
            /*
             * For TLS 1.2, we need to specify signature and hash algorithm
             * explicitly through a prefix to the signature.
             *
             * struct {
             *    HashAlgorithm hash;
             *    SignatureAlgorithm signature;
             * } SignatureAndHashAlgorithm;
             *
             * struct {
             *    SignatureAndHashAlgorithm algorithm;
             *    opaque signature<0..2^16-1>;
             * } DigitallySigned;
             *
             */

            *(p++) = mbedtls_ssl_hash_from_md_alg( md_alg );
            *(p++) = mbedtls_ssl_sig_from_pk_alg( sig_alg );

            n += 2;
        }
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */

        if( ( ret = mbedtls_pk_sign( mbedtls_ssl_own_key( ssl ), md_alg, hash, hashlen,
                        p + 2 , &signature_len, ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_pk_sign", ret );
            return( ret );
        }

        *(p++) = (unsigned char)( signature_len >> 8 );
        *(p++) = (unsigned char)( signature_len      );
        n += 2;

        MBEDTLS_SSL_DEBUG_BUF( 3, "my signature", p, signature_len );

        n += signature_len;
    }
#endif /* MBEDTLS_KEY_EXCHANGE__WITH_SERVER_SIGNATURE__ENABLED */

    /* Done with actual work; add header and send. */

    ssl->out_msglen  = 4 + n;
    ssl->out_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
    ssl->out_msg[0]  = MBEDTLS_SSL_HS_SERVER_KEY_EXCHANGE;

    ssl->state++;

    if( ( ret = mbedtls_ssl_write_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_write_record", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write server key exchange" ) );

    return( 0 );
}